

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cExplicitUniformLocationTest.cpp
# Opt level: O0

void glcts::anon_unknown_0::ShaderSourceFactory::streamUniformValidator
               (ostringstream *ret,Uniform *uniform,GLenum shader,char *outTemporary)

{
  bool bVar1;
  GLenum GVar2;
  int iVar3;
  size_type sVar4;
  const_reference uniform_00;
  ostream *poVar5;
  string *psVar6;
  undefined4 extraout_var;
  pair<int,_int> pVar7;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  int local_238;
  string local_230 [8];
  string absoluteF;
  undefined1 local_1e0 [8];
  ostringstream str;
  string local_60 [8];
  string columnIndex;
  int local_38;
  int local_34;
  int column;
  int arrayElement;
  size_t child;
  char *outTemporary_local;
  GLenum shader_local;
  Uniform *uniform_local;
  ostringstream *ret_local;
  
  bVar1 = DefOccurence::occurs(&uniform->declOccurence,shader);
  if ((bVar1) && (bVar1 = DefOccurence::occurs(&uniform->usageOccurence,shader), bVar1)) {
    bVar1 = UniformType::isStruct(&uniform->type);
    if (bVar1) {
      for (_column = 0;
          sVar4 = std::
                  vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
                  ::size(&uniform->childUniforms), _column < sVar4; _column = _column + 1) {
        uniform_00 = std::
                     vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
                     ::operator[](&uniform->childUniforms,_column);
        streamUniformValidator(ret,uniform_00,shader,outTemporary);
      }
    }
    else {
      for (local_34 = 0; local_34 < (uniform->type).arraySize; local_34 = local_34 + 1) {
        local_38 = 0;
        while( true ) {
          columnIndex.field_2._8_8_ = UniformType::getSize(&uniform->type);
          if ((int)columnIndex.field_2._12_4_ <= local_38) break;
          std::__cxx11::string::string(local_60);
          str._368_8_ = UniformType::getSize(&uniform->type);
          if (1 < (int)str._372_4_) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e0);
            poVar5 = std::operator<<((ostream *)local_1e0,"[");
            poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_38);
            std::operator<<(poVar5,"]");
            std::__cxx11::ostringstream::str();
            std::__cxx11::string::operator=(local_60,(string *)(absoluteF.field_2._M_local_buf + 8))
            ;
            std::__cxx11::string::~string((string *)(absoluteF.field_2._M_local_buf + 8));
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e0);
          }
          std::__cxx11::string::string(local_230);
          bVar1 = UniformType::isSigned(&uniform->type);
          if (bVar1) {
            std::__cxx11::string::operator=(local_230,"abs");
          }
          GVar2 = UniformType::getBaseType(&uniform->type);
          if (GVar2 == 0x82e6) {
            poVar5 = std::operator<<(&ret->super_basic_ostream<char,_std::char_traits<char>_>,
                                     "\n    if (any(greaterThan(");
            poVar5 = std::operator<<(poVar5,local_230);
            poVar5 = std::operator<<(poVar5,"(texture(");
            psVar6 = glcts::(anonymous_namespace)::Uniform::getName_abi_cxx11_((Uniform *)uniform);
            std::operator<<(poVar5,(string *)psVar6);
            UniformType::streamArrayStr(&uniform->type,ret,local_34);
            poVar5 = std::operator<<(&ret->super_basic_ostream<char,_std::char_traits<char>_>,
                                     local_60);
            std::operator<<(poVar5,", vec2(0.5)) - ");
            UniformValue::streamValue(&uniform->value,ret,local_34,local_38);
            poVar5 = std::operator<<(&ret->super_basic_ostream<char,_std::char_traits<char>_>," ), "
                                    );
            psVar6 = glcts::(anonymous_namespace)::UniformType::refStr_abi_cxx11_
                               ((UniformType *)uniform);
            poVar5 = std::operator<<(poVar5,(string *)psVar6);
            iVar3 = 0x2b0b32f;
            poVar5 = std::operator<<(poVar5,"(");
            iVar3 = UniformType::abs(&uniform->type,iVar3);
            poVar5 = std::operator<<(poVar5,(char *)CONCAT44(extraout_var,iVar3));
            std::operator<<(poVar5,")))) {");
          }
          else {
            pVar7 = UniformType::getSize(&uniform->type);
            local_238 = pVar7.first;
            if (local_238 < 2) {
              poVar5 = std::operator<<(&ret->super_basic_ostream<char,_std::char_traits<char>_>,
                                       "\n    if (");
              poVar5 = std::operator<<(poVar5,local_230);
              poVar5 = std::operator<<(poVar5,"(");
              psVar6 = glcts::(anonymous_namespace)::Uniform::getName_abi_cxx11_((Uniform *)uniform)
              ;
              std::operator<<(poVar5,(string *)psVar6);
              UniformType::streamArrayStr(&uniform->type,ret,local_34);
              std::operator<<(&ret->super_basic_ostream<char,_std::char_traits<char>_>," - ");
              UniformValue::streamValue(&uniform->value,ret,local_34,0);
              poVar5 = std::operator<<(&ret->super_basic_ostream<char,_std::char_traits<char>_>,
                                       ") >");
              psVar6 = glcts::(anonymous_namespace)::UniformType::refStr_abi_cxx11_
                                 ((UniformType *)uniform);
              poVar5 = std::operator<<(poVar5,(string *)psVar6);
              iVar3 = 0x2b0b32f;
              poVar5 = std::operator<<(poVar5,"(");
              iVar3 = UniformType::abs(&uniform->type,iVar3);
              poVar5 = std::operator<<(poVar5,(char *)CONCAT44(extraout_var_01,iVar3));
              std::operator<<(poVar5,")) {");
            }
            else {
              poVar5 = std::operator<<(&ret->super_basic_ostream<char,_std::char_traits<char>_>,
                                       "\n    if (any(greaterThan(");
              poVar5 = std::operator<<(poVar5,local_230);
              poVar5 = std::operator<<(poVar5,"(");
              psVar6 = glcts::(anonymous_namespace)::Uniform::getName_abi_cxx11_((Uniform *)uniform)
              ;
              std::operator<<(poVar5,(string *)psVar6);
              UniformType::streamArrayStr(&uniform->type,ret,local_34);
              poVar5 = std::operator<<(&ret->super_basic_ostream<char,_std::char_traits<char>_>,
                                       local_60);
              std::operator<<(poVar5," - ");
              UniformValue::streamValue(&uniform->value,ret,local_34,local_38);
              poVar5 = std::operator<<(&ret->super_basic_ostream<char,_std::char_traits<char>_>,
                                       "), ");
              psVar6 = glcts::(anonymous_namespace)::UniformType::refStr_abi_cxx11_
                                 ((UniformType *)uniform);
              poVar5 = std::operator<<(poVar5,(string *)psVar6);
              iVar3 = 0x2b0b32f;
              poVar5 = std::operator<<(poVar5,"(");
              iVar3 = UniformType::abs(&uniform->type,iVar3);
              poVar5 = std::operator<<(poVar5,(char *)CONCAT44(extraout_var_00,iVar3));
              std::operator<<(poVar5,")))) {");
            }
          }
          poVar5 = std::operator<<(&ret->super_basic_ostream<char,_std::char_traits<char>_>,
                                   "\n       ");
          poVar5 = std::operator<<(poVar5,outTemporary);
          std::operator<<(poVar5," = vec4 (1.0, 0.0, 0.0, 1.0);");
          std::operator<<(&ret->super_basic_ostream<char,_std::char_traits<char>_>,"\n    }");
          std::__cxx11::string::~string(local_230);
          std::__cxx11::string::~string(local_60);
          local_38 = local_38 + 1;
        }
      }
    }
  }
  return;
}

Assistant:

static void streamUniformValidator(std::ostringstream& ret, const Uniform& uniform, GLenum shader,
									   const char* outTemporary)
	{
		if (uniform.declOccurence.occurs(shader) && uniform.usageOccurence.occurs(shader))
		{
			if (uniform.type.isStruct())
			{
				for (size_t child = 0; child < uniform.childUniforms.size(); child++)
				{
					streamUniformValidator(ret, uniform.childUniforms[child], shader, outTemporary);
				}
			}
			else
			{
				for (int arrayElement = 0; arrayElement < uniform.type.arraySize; arrayElement++)
				{
					for (int column = 0; column < uniform.type.getSize().second; column++)
					{
						std::string columnIndex;
						if (uniform.type.getSize().second > 1)
						{
							std::ostringstream str;
							str << "[" << column << "]";
							columnIndex = str.str();
						}
						std::string absoluteF;
						if (uniform.type.isSigned())
						{
							absoluteF = "abs";
						}

						if (uniform.type.getBaseType() == GL_SAMPLER)
						{
							ret << NL "    if (any(greaterThan(" << absoluteF << "(texture(" << uniform.getName();
							uniform.type.streamArrayStr(ret, arrayElement);
							ret << columnIndex << ", vec2(0.5)) - ";
							uniform.value.streamValue(ret, arrayElement, column);
							ret << " ), " << uniform.type.refStr() << "(" << uniform.type.abs() << ")))) {";
						}
						else if (uniform.type.getSize().first > 1)
						{
							ret << NL "    if (any(greaterThan(" << absoluteF << "(" << uniform.getName();
							uniform.type.streamArrayStr(ret, arrayElement);
							ret << columnIndex << " - ";
							uniform.value.streamValue(ret, arrayElement, column);
							ret << "), " << uniform.type.refStr() << "(" << uniform.type.abs() << ")))) {";
						}
						else
						{
							ret << NL "    if (" << absoluteF << "(" << uniform.getName();
							uniform.type.streamArrayStr(ret, arrayElement);
							ret << " - ";
							uniform.value.streamValue(ret, arrayElement);
							ret << ") >" << uniform.type.refStr() << "(" << uniform.type.abs() << ")) {";
						}
						ret << NL "       " << outTemporary << " = vec4 (1.0, 0.0, 0.0, 1.0);";
						ret << NL "    }";
					}
				}
			}
		}
	}